

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::resize
          (small_vector<unsigned_char,_128UL> *this,size_t new_elements)

{
  ulong uVar1;
  uchar *__src;
  size_type __new_size;
  array<unsigned_char,_128UL> *__dest;
  
  uVar1 = this->elements_;
  if (uVar1 != new_elements) {
    __new_size = 0;
    if (0x80 < new_elements) {
      __new_size = new_elements;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->big_buffer_,__new_size);
    if (new_elements < 0x81) {
      __dest = &this->small_buffer_;
    }
    else {
      __dest = (array<unsigned_char,_128UL> *)
               (this->big_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    __src = this->buffer_;
    this->buffer_ = __dest->_M_elems;
    if ((new_elements < 0x81 != uVar1 < 0x81) && (this->elements_ != 0)) {
      memmove(__dest,__src,this->elements_);
    }
    this->elements_ = new_elements;
  }
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::resize (std::size_t new_elements) {
        if (new_elements != elements_) {
            bool const is_small_before = is_small (elements_);
            bool const is_small_after = is_small (new_elements);

            big_buffer_.resize (is_small_after ? 0 : new_elements);

            // Update the buffer pointer and preserve the contents if we've switched from small to
            // larger buffer or vice-versa.
            auto * const old_buffer = buffer_;
            auto * const new_buffer = this->set_buffer_ptr (new_elements);

            if (is_small_before != is_small_after) {
                std::copy (old_buffer, old_buffer + elements_, new_buffer);
            }

            elements_ = new_elements;
        }
    }